

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

string * just::environment::impl::append_to_path
                   (string *__return_storage_ptr__,string *item_,string *path_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var1;
  bool bVar2;
  string *__rhs;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  path_separator_abi_cxx11_();
  if ((path_->_M_string_length == 0) || (_Var1 = std::operator==(path_,&local_60), _Var1)) {
    std::operator+(__return_storage_ptr__,item_,path_);
  }
  else {
    bVar2 = ends_with(path_,&local_60);
    __rhs = item_;
    __lhs = &local_60;
    if (bVar2) {
      __rhs = &local_60;
      __lhs = item_;
    }
    std::operator+(&local_40,__lhs,__rhs);
    std::operator+(__return_storage_ptr__,path_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::string append_to_path(
        const std::string& item_,
        const std::string& path_
      )
      {
        const std::string sep = path_separator();

        if (path_.empty() || path_ == sep)
        {
          return item_ + path_;
        }
        else
        {
          return path_ + (ends_with(path_, sep) ? item_ + sep : sep + item_);
        }
      }